

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlGetPropNodeValueInternal(xmlAttr *prop)

{
  xmlAttr *prop_local;
  
  if (prop == (xmlAttr *)0x0) {
    prop_local = (xmlAttr *)0x0;
  }
  else if (prop->type == XML_ATTRIBUTE_NODE) {
    prop_local = (xmlAttr *)xmlNodeGetContent((xmlNode *)prop);
  }
  else if (prop->type == XML_ATTRIBUTE_DECL) {
    prop_local = (xmlAttr *)xmlStrdup((xmlChar *)prop->psvi);
  }
  else {
    prop_local = (xmlAttr *)0x0;
  }
  return (xmlChar *)prop_local;
}

Assistant:

static xmlChar*
xmlGetPropNodeValueInternal(const xmlAttr *prop)
{
    if (prop == NULL)
	return(NULL);
    if (prop->type == XML_ATTRIBUTE_NODE) {
	return(xmlNodeGetContent((xmlNodePtr) prop));
    } else if (prop->type == XML_ATTRIBUTE_DECL) {
	return(xmlStrdup(((xmlAttributePtr)prop)->defaultValue));
    }
    return(NULL);
}